

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event_loop.cpp
# Opt level: O0

void __thiscall EventLoop::quit(EventLoop *this)

{
  bool bVar1;
  EventLoop *this_local;
  
  this->el_quit = true;
  bVar1 = is_in_loop_thread(this);
  if (!bVar1) {
    evfd_wakeup(this);
  }
  return;
}

Assistant:

void EventLoop::quit() {
    el_quit = true;
    if (!is_in_loop_thread()) {
        evfd_wakeup();
    }
}